

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMan.c
# Opt level: O0

Lpk_Man_t * Lpk_ManStart(Lpk_Par_t *pPars)

{
  int iVar1;
  Lpk_Man_t *__s;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *pVVar3;
  Kit_DsdMan_t *pKVar4;
  uint *puVar5;
  int local_1c;
  int nWords;
  int i;
  Lpk_Man_t *p;
  Lpk_Par_t *pPars_local;
  
  if (0x10 < pPars->nLutsMax) {
    __assert_fail("pPars->nLutsMax <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkMan.c"
                  ,0x31,"Lpk_Man_t *Lpk_ManStart(Lpk_Par_t *)");
  }
  if ((0 < pPars->nVarsMax) && (pPars->nVarsMax < 0x11)) {
    __s = (Lpk_Man_t *)malloc(0x7dc358);
    memset(__s,0,0x7dc358);
    __s->pPars = pPars;
    __s->nCutsMax = 10000;
    pVVar2 = Vec_PtrAllocTruthTables(pPars->nVarsMax);
    __s->vTtElems = pVVar2;
    iVar1 = Abc_TruthWordNum(pPars->nVarsMax);
    pVVar2 = Vec_PtrAllocSimInfo(0x400,iVar1);
    __s->vTtNodes = pVVar2;
    pVVar3 = Vec_IntAlloc(0x1000);
    __s->vCover = pVVar3;
    pVVar2 = Vec_PtrAlloc(0x20);
    __s->vLeaves = pVVar2;
    pVVar2 = Vec_PtrAlloc(0x20);
    __s->vTemp = pVVar2;
    for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
      pVVar3 = Vec_IntAlloc(100);
      __s->vSets[local_1c] = pVVar3;
    }
    pKVar4 = Kit_DsdManAlloc(pPars->nVarsMax,0x40);
    __s->pDsdMan = pKVar4;
    pVVar3 = Vec_IntAlloc(0x8000);
    __s->vMemory = pVVar3;
    pVVar3 = Vec_IntAlloc(0x100);
    __s->vBddDir = pVVar3;
    pVVar3 = Vec_IntAlloc(0x100);
    __s->vBddInv = pVVar3;
    iVar1 = Kit_TruthWordNum(pPars->nVarsMax);
    puVar5 = (uint *)malloc((long)(iVar1 << 5) << 2);
    __s->ppTruths[0][0] = puVar5;
    __s->ppTruths[1][0] = __s->ppTruths[0][0] + iVar1;
    for (local_1c = 1; local_1c < 2; local_1c = local_1c + 1) {
      __s->ppTruths[1][local_1c] = __s->ppTruths[1][0] + local_1c * iVar1;
    }
    __s->ppTruths[2][0] = __s->ppTruths[1][0] + (iVar1 << 1);
    for (local_1c = 1; local_1c < 4; local_1c = local_1c + 1) {
      __s->ppTruths[2][local_1c] = __s->ppTruths[2][0] + local_1c * iVar1;
    }
    __s->ppTruths[3][0] = __s->ppTruths[2][0] + (iVar1 << 2);
    for (local_1c = 1; local_1c < 8; local_1c = local_1c + 1) {
      __s->ppTruths[3][local_1c] = __s->ppTruths[3][0] + local_1c * iVar1;
    }
    __s->ppTruths[4][0] = __s->ppTruths[3][0] + (iVar1 << 3);
    for (local_1c = 1; local_1c < 0x10; local_1c = local_1c + 1) {
      __s->vSets[(long)local_1c + -0x10] = (Vec_Int_t *)(__s->ppTruths[4][0] + local_1c * iVar1);
    }
    return __s;
  }
  __assert_fail("pPars->nVarsMax > 0 && pPars->nVarsMax <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkMan.c"
                ,0x32,"Lpk_Man_t *Lpk_ManStart(Lpk_Par_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Lpk_Man_t * Lpk_ManStart( Lpk_Par_t * pPars )
{
    Lpk_Man_t * p;
    int i, nWords;
    assert( pPars->nLutsMax <= 16 );
    assert( pPars->nVarsMax > 0 && pPars->nVarsMax <= 16 );
    p = ABC_ALLOC( Lpk_Man_t, 1 );
    memset( p, 0, sizeof(Lpk_Man_t) );
    p->pPars = pPars;
    p->nCutsMax = LPK_CUTS_MAX;
    p->vTtElems = Vec_PtrAllocTruthTables( pPars->nVarsMax );
    p->vTtNodes = Vec_PtrAllocSimInfo( 1024, Abc_TruthWordNum(pPars->nVarsMax) );
    p->vCover   = Vec_IntAlloc( 1 << 12 );
    p->vLeaves  = Vec_PtrAlloc( 32 );
    p->vTemp    = Vec_PtrAlloc( 32 );
    for ( i = 0; i < 8; i++ )
        p->vSets[i] = Vec_IntAlloc(100);
    p->pDsdMan = Kit_DsdManAlloc( pPars->nVarsMax, 64 );
    p->vMemory = Vec_IntAlloc( 1024 * 32 );
    p->vBddDir = Vec_IntAlloc( 256 );
    p->vBddInv = Vec_IntAlloc( 256 );
    // allocate temporary storage for truth tables
    nWords = Kit_TruthWordNum(pPars->nVarsMax);
    p->ppTruths[0][0] = ABC_ALLOC( unsigned, 32 * nWords );
    p->ppTruths[1][0] = p->ppTruths[0][0] + 1 * nWords;
    for ( i = 1; i < 2; i++ )
        p->ppTruths[1][i] = p->ppTruths[1][0] + i * nWords;
    p->ppTruths[2][0] = p->ppTruths[1][0] + 2 * nWords;
    for ( i = 1; i < 4; i++ )
        p->ppTruths[2][i] = p->ppTruths[2][0] + i * nWords;
    p->ppTruths[3][0] = p->ppTruths[2][0] + 4 * nWords; 
    for ( i = 1; i < 8; i++ )
        p->ppTruths[3][i] = p->ppTruths[3][0] + i * nWords;
    p->ppTruths[4][0] = p->ppTruths[3][0] + 8 * nWords; 
    for ( i = 1; i < 16; i++ )
        p->ppTruths[4][i] = p->ppTruths[4][0] + i * nWords;
    return p;
}